

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O3

void jinit_c_master_control(j_compress_ptr cinfo,boolean transcode_only)

{
  jpeg_scan_info *pjVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  jpeg_error_mgr *pjVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  jpeg_comp_master *pjVar11;
  long lVar12;
  int *piVar13;
  int iVar14;
  size_t __n;
  ulong uVar15;
  long lVar16;
  uint *puVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  jpeg_scan_info *pjVar21;
  int iVar22;
  jpeg_scan_info *pjVar23;
  ulong uVar24;
  jpeg_component_info *pjVar25;
  boolean component_sent [10];
  uint local_a68 [12];
  uint local_a38 [642];
  
  pjVar11 = (jpeg_comp_master *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x30);
  cinfo->master = pjVar11;
  pjVar11->prepare_for_pass = prepare_for_pass;
  pjVar11->pass_startup = pass_startup;
  pjVar11->finish_pass = finish_pass_master;
  pjVar11->is_last_pass = 0;
  if (transcode_only == 0) {
    jpeg_calc_jpeg_dimensions(cinfo);
    iVar22 = cinfo->block_size;
  }
  else {
    iVar22 = cinfo->min_DCT_h_scaled_size;
    if (iVar22 != cinfo->min_DCT_v_scaled_size) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 7;
      (pjVar5->msg_parm).i[0] = iVar22;
      (cinfo->err->msg_parm).i[1] = cinfo->min_DCT_v_scaled_size;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      iVar22 = cinfo->min_DCT_h_scaled_size;
    }
    cinfo->block_size = iVar22;
  }
  if (iVar22 - 0x11U < 0xfffffff0) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 7;
    (pjVar5->msg_parm).i[0] = iVar22;
    (cinfo->err->msg_parm).i[1] = cinfo->block_size;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    iVar22 = cinfo->block_size;
  }
  if (iVar22 - 2U < 6) {
    piVar13 = (int *)(&PTR_jpeg_natural_order2_0015f6e0)[iVar22 - 2U];
  }
  else {
    piVar13 = jpeg_natural_order;
  }
  iVar9 = 0x3f;
  if (iVar22 < 8) {
    iVar9 = iVar22 * iVar22 + -1;
  }
  cinfo->natural_order = piVar13;
  cinfo->lim_Se = iVar9;
  uVar10 = cinfo->jpeg_height;
  if ((((uVar10 == 0) || (cinfo->jpeg_width == 0)) || (cinfo->num_components < 1)) ||
     (cinfo->input_components < 1)) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x21;
    (*pjVar5->error_exit)((j_common_ptr)cinfo);
    uVar10 = cinfo->jpeg_height;
  }
  if ((0xffdc < uVar10) || (0xffdc < cinfo->jpeg_width)) {
    *(undefined8 *)&cinfo->err->msg_code = 0xffdc0000002a;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if ((long)cinfo->input_components * (ulong)cinfo->image_width >> 0x20 != 0) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x48;
    (*pjVar5->error_exit)((j_common_ptr)cinfo);
  }
  iVar22 = cinfo->data_precision;
  if (iVar22 != 8) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x10;
    (pjVar5->msg_parm).i[0] = iVar22;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar22 = cinfo->num_components;
  if (10 < iVar22) {
    pjVar5 = cinfo->err;
    pjVar5->msg_code = 0x1b;
    (pjVar5->msg_parm).i[0] = iVar22;
    (cinfo->err->msg_parm).i[1] = 10;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    iVar22 = cinfo->num_components;
  }
  cinfo->max_h_samp_factor = 1;
  cinfo->max_v_samp_factor = 1;
  if (iVar22 < 1) {
    iVar9 = 1;
  }
  else {
    piVar13 = &cinfo->comp_info->v_samp_factor;
    iVar18 = 0;
    iVar19 = 1;
    iVar20 = 1;
    do {
      iVar14 = piVar13[-1];
      if ((iVar14 - 5U < 0xfffffffc) || (iVar9 = *piVar13, iVar9 - 5U < 0xfffffffc)) {
        pjVar5 = cinfo->err;
        pjVar5->msg_code = 0x13;
        (*pjVar5->error_exit)((j_common_ptr)cinfo);
        iVar22 = cinfo->num_components;
        iVar19 = cinfo->max_h_samp_factor;
        iVar14 = piVar13[-1];
        iVar9 = *piVar13;
        iVar20 = cinfo->max_v_samp_factor;
      }
      if (iVar14 < iVar19) {
        iVar14 = iVar19;
      }
      iVar19 = iVar14;
      cinfo->max_h_samp_factor = iVar19;
      if (iVar9 < iVar20) {
        iVar9 = iVar20;
      }
      cinfo->max_v_samp_factor = iVar9;
      iVar18 = iVar18 + 1;
      piVar13 = piVar13 + 0x18;
      iVar20 = iVar9;
    } while (iVar18 < iVar22);
    if (0 < iVar22) {
      pjVar25 = cinfo->comp_info;
      iVar22 = 0;
      do {
        pjVar25->component_index = iVar22;
        iVar9 = cinfo->min_DCT_h_scaled_size;
        iVar20 = (uint)(cinfo->do_fancy_downsampling != 0) * 4 + 4;
        iVar19 = iVar9;
        if (iVar9 <= iVar20) {
          iVar18 = 1;
          do {
            if (cinfo->max_h_samp_factor % (pjVar25->h_samp_factor * 2 * iVar18) != 0) {
              iVar19 = iVar18 * iVar9;
              break;
            }
            iVar18 = iVar18 * 2;
            iVar19 = iVar18 * iVar9;
          } while (iVar18 * iVar9 <= iVar20);
        }
        pjVar25->DCT_h_scaled_size = iVar19;
        iVar9 = cinfo->min_DCT_v_scaled_size;
        iVar18 = iVar9;
        if (iVar9 <= iVar20) {
          iVar14 = 1;
          do {
            if (cinfo->max_v_samp_factor % (pjVar25->v_samp_factor * 2 * iVar14) != 0) {
              iVar18 = iVar14 * iVar9;
              break;
            }
            iVar14 = iVar14 * 2;
            iVar18 = iVar14 * iVar9;
          } while (iVar14 * iVar9 <= iVar20);
        }
        pjVar25->DCT_v_scaled_size = iVar18;
        iVar9 = iVar18 * 2;
        if (iVar19 == iVar9 || SBORROW4(iVar19,iVar9) != iVar19 + iVar18 * -2 < 0) {
          if (iVar19 * 2 < iVar18) {
            pjVar25->DCT_v_scaled_size = iVar19 * 2;
          }
        }
        else {
          pjVar25->DCT_h_scaled_size = iVar9;
        }
        lVar12 = jdiv_round_up((long)pjVar25->h_samp_factor * (ulong)cinfo->jpeg_width,
                               (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
        pjVar25->width_in_blocks = (JDIMENSION)lVar12;
        lVar12 = jdiv_round_up((long)pjVar25->v_samp_factor * (ulong)cinfo->jpeg_height,
                               (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
        pjVar25->height_in_blocks = (JDIMENSION)lVar12;
        lVar12 = jdiv_round_up((long)pjVar25->DCT_h_scaled_size * (long)pjVar25->h_samp_factor *
                               (ulong)cinfo->jpeg_width,
                               (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
        pjVar25->downsampled_width = (JDIMENSION)lVar12;
        lVar12 = jdiv_round_up((long)pjVar25->DCT_v_scaled_size * (long)pjVar25->v_samp_factor *
                               (ulong)cinfo->jpeg_height,
                               (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
        pjVar25->downsampled_height = (JDIMENSION)lVar12;
        pjVar25->component_needed = 1;
        iVar22 = iVar22 + 1;
        pjVar25 = pjVar25 + 1;
      } while (iVar22 < cinfo->num_components);
      iVar9 = cinfo->max_v_samp_factor;
    }
  }
  lVar12 = jdiv_round_up((ulong)cinfo->jpeg_height,(long)iVar9 * (long)cinfo->block_size);
  cinfo->total_iMCU_rows = (JDIMENSION)lVar12;
  pjVar23 = cinfo->scan_info;
  if (pjVar23 == (jpeg_scan_info *)0x0) {
    cinfo->progressive_mode = 0;
    iVar22 = 1;
LAB_0010dfee:
    cinfo->num_scans = iVar22;
  }
  else {
    if (cinfo->num_scans < 1) {
      *(undefined8 *)&cinfo->err->msg_code = 0x14;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      pjVar23 = cinfo->scan_info;
    }
    if ((pjVar23->Ss == 0) && (pjVar23->Se == 0x3f)) {
      cinfo->progressive_mode = 0;
      uVar24 = (ulong)cinfo->num_components;
      if ((long)uVar24 < 1) {
        iVar22 = 0;
      }
      else {
        __n = uVar24 << 2;
        puVar17 = local_a68;
        iVar9 = 0;
        iVar22 = 0;
LAB_0010dbf0:
        memset(puVar17,iVar9,__n);
      }
    }
    else {
      cinfo->progressive_mode = 1;
      uVar24 = (ulong)cinfo->num_components;
      iVar22 = 1;
      if (0 < (long)uVar24) {
        __n = uVar24 << 8;
        puVar17 = local_a38;
        iVar9 = 0xff;
        iVar22 = 1;
        goto LAB_0010dbf0;
      }
    }
    if (0 < cinfo->num_scans) {
      iVar22 = 1;
      do {
        uVar10 = pjVar23->comps_in_scan;
        uVar24 = (ulong)uVar10;
        if (uVar10 - 5 < 0xfffffffc) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x1b;
          (pjVar5->msg_parm).i[0] = uVar10;
          (cinfo->err->msg_parm).i[1] = 4;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          if (0 < (int)uVar10) goto LAB_0010dc4a;
          bVar6 = false;
        }
        else {
LAB_0010dc4a:
          uVar15 = 0;
          do {
            iVar9 = pjVar23->component_index[uVar15];
            if ((iVar9 < 0) || (cinfo->num_components <= iVar9)) {
              pjVar5 = cinfo->err;
              pjVar5->msg_code = 0x14;
              (pjVar5->msg_parm).i[0] = iVar22;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
            if ((uVar15 != 0) && (iVar9 <= pjVar23->component_index[uVar15 - 1])) {
              pjVar5 = cinfo->err;
              pjVar5->msg_code = 0x14;
              (pjVar5->msg_parm).i[0] = iVar22;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
            uVar15 = uVar15 + 1;
          } while (uVar24 != uVar15);
          bVar6 = true;
        }
        uVar2 = pjVar23->Ss;
        iVar9 = pjVar23->Se;
        uVar3 = pjVar23->Ah;
        uVar4 = pjVar23->Al;
        if (cinfo->progressive_mode == 0) {
          if ((((uVar2 != 0) || (iVar9 != 0x3f)) || (uVar3 != 0)) || (uVar4 != 0)) {
            pjVar5 = cinfo->err;
            pjVar5->msg_code = 0x12;
            (pjVar5->msg_parm).i[0] = iVar22;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (bVar6) {
            uVar15 = 0;
            do {
              iVar9 = pjVar23->component_index[uVar15];
              if (local_a68[iVar9] != 0) {
                pjVar5 = cinfo->err;
                pjVar5->msg_code = 0x14;
                (pjVar5->msg_parm).i[0] = iVar22;
                (*cinfo->err->error_exit)((j_common_ptr)cinfo);
              }
              local_a68[iVar9] = 1;
              uVar15 = uVar15 + 1;
            } while (uVar24 != uVar15);
          }
        }
        else {
          if ((0x3f < uVar2) || ((10 < uVar4 || 10 < uVar3) || (0x3f < iVar9 || iVar9 < (int)uVar2))
             ) {
            pjVar5 = cinfo->err;
            pjVar5->msg_code = 0x12;
            (pjVar5->msg_parm).i[0] = iVar22;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (uVar2 == 0) {
            if (iVar9 != 0) goto LAB_0010dd2a;
          }
          else if (uVar10 != 1) {
LAB_0010dd2a:
            pjVar5 = cinfo->err;
            pjVar5->msg_code = 0x12;
            (pjVar5->msg_parm).i[0] = iVar22;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (bVar6) {
            uVar15 = 0;
            do {
              lVar12 = (long)pjVar23->component_index[uVar15];
              if ((uVar2 != 0) && ((int)local_a38[lVar12 * 0x40] < 0)) {
                pjVar5 = cinfo->err;
                pjVar5->msg_code = 0x12;
                (pjVar5->msg_parm).i[0] = iVar22;
                (*cinfo->err->error_exit)((j_common_ptr)cinfo);
              }
              if ((int)uVar2 <= iVar9) {
                lVar16 = 0;
                do {
                  if ((int)local_a38[(long)(int)uVar2 + lVar12 * 0x40 + lVar16] < 0) {
                    if (uVar3 != 0) goto LAB_0010ddf6;
                  }
                  else if (local_a38[(long)(int)uVar2 + lVar12 * 0x40 + lVar16] != uVar3 ||
                           uVar3 - 1 != uVar4) {
LAB_0010ddf6:
                    pjVar5 = cinfo->err;
                    pjVar5->msg_code = 0x12;
                    (pjVar5->msg_parm).i[0] = iVar22;
                    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
                  }
                  local_a38[(long)(int)uVar2 + lVar12 * 0x40 + lVar16] = uVar4;
                  lVar16 = lVar16 + 1;
                } while ((iVar9 - uVar2) + 1 != (int)lVar16);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar24);
          }
        }
        pjVar23 = pjVar23 + 1;
        bVar6 = iVar22 < cinfo->num_scans;
        iVar22 = iVar22 + 1;
      } while (bVar6);
      uVar24 = (ulong)(uint)cinfo->num_components;
      iVar22 = cinfo->progressive_mode;
    }
    if (iVar22 == 0) {
      if (0 < (int)uVar24) {
        lVar12 = 0;
        do {
          if (local_a68[lVar12] == 0) {
            pjVar5 = cinfo->err;
            pjVar5->msg_code = 0x2e;
            (*pjVar5->error_exit)((j_common_ptr)cinfo);
            uVar24 = (ulong)(uint)cinfo->num_components;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < (int)uVar24);
      }
    }
    else if (0 < (int)uVar24) {
      puVar17 = local_a38;
      lVar12 = 0;
      do {
        if ((int)*puVar17 < 0) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x2e;
          (*pjVar5->error_exit)((j_common_ptr)cinfo);
          uVar24 = (ulong)(uint)cinfo->num_components;
        }
        lVar12 = lVar12 + 1;
        puVar17 = puVar17 + 0x40;
      } while (lVar12 < (int)uVar24);
    }
    if (cinfo->block_size < 8) {
      if (cinfo->num_scans < 1) {
        iVar22 = 0;
      }
      else {
        pjVar23 = cinfo->scan_info;
        uVar15 = 0;
        uVar24 = 0;
        pjVar21 = pjVar23;
        do {
          iVar22 = (int)uVar24;
          if (uVar15 != uVar24) {
            pjVar23[iVar22].Al = pjVar21->Al;
            iVar9 = pjVar21->comps_in_scan;
            iVar19 = pjVar21->component_index[0];
            uVar7 = *(undefined8 *)(pjVar21->component_index + 1);
            uVar8 = *(undefined8 *)&pjVar21->Se;
            *(undefined8 *)(pjVar23[iVar22].component_index + 3) =
                 *(undefined8 *)(pjVar21->component_index + 3);
            *(undefined8 *)(pjVar23[iVar22].component_index + 3 + 2) = uVar8;
            pjVar1 = pjVar23 + iVar22;
            pjVar1->comps_in_scan = iVar9;
            pjVar1->component_index[0] = iVar19;
            *(undefined8 *)(pjVar1->component_index + 1) = uVar7;
          }
          iVar9 = cinfo->lim_Se;
          if (pjVar23[iVar22].Ss <= iVar9) {
            if (iVar9 < pjVar23[iVar22].Se) {
              pjVar23[iVar22].Se = iVar9;
            }
            uVar24 = (ulong)(iVar22 + 1);
          }
          iVar22 = (int)uVar24;
          uVar15 = uVar15 + 1;
          pjVar21 = pjVar21 + 1;
        } while ((long)uVar15 < (long)cinfo->num_scans);
      }
      goto LAB_0010dfee;
    }
  }
  if (((cinfo->progressive_mode != 0) || (cinfo->block_size < 8)) && (cinfo->arith_code == 0)) {
    cinfo->optimize_coding = 1;
  }
  if (transcode_only == 0) {
    *(undefined4 *)&pjVar11[1].prepare_for_pass = 0;
    iVar22 = cinfo->optimize_coding;
    *(undefined4 *)((long)&pjVar11[1].pass_startup + 4) = 0;
    *(undefined4 *)((long)&pjVar11[1].prepare_for_pass + 4) = 0;
    if (iVar22 == 0) goto LAB_0010e073;
  }
  else {
    if (cinfo->optimize_coding == 0) {
      pjVar11[1].prepare_for_pass = (_func_void_j_compress_ptr *)0x2;
      *(undefined4 *)((long)&pjVar11[1].pass_startup + 4) = 0;
LAB_0010e073:
      iVar22 = cinfo->num_scans;
      goto LAB_0010e07a;
    }
    pjVar11[1].prepare_for_pass = (_func_void_j_compress_ptr *)0x1;
    *(undefined4 *)((long)&pjVar11[1].pass_startup + 4) = 0;
  }
  iVar22 = cinfo->num_scans * 2;
LAB_0010e07a:
  *(int *)&pjVar11[1].pass_startup = iVar22;
  return;
}

Assistant:

GLOBAL(void)
jinit_c_master_control (j_compress_ptr cinfo, boolean transcode_only)
{
  my_master_ptr master;

  master = (my_master_ptr)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(my_comp_master));
  cinfo->master = (struct jpeg_comp_master *) master;
  master->pub.prepare_for_pass = prepare_for_pass;
  master->pub.pass_startup = pass_startup;
  master->pub.finish_pass = finish_pass_master;
  master->pub.is_last_pass = FALSE;

  /* Validate parameters, determine derived values */
  initial_setup(cinfo, transcode_only);

  if (cinfo->scan_info != NULL) {
#ifdef C_MULTISCAN_FILES_SUPPORTED
    validate_script(cinfo);
    if (cinfo->block_size < DCTSIZE)
      reduce_script(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    cinfo->progressive_mode = FALSE;
    cinfo->num_scans = 1;
  }

  if ((cinfo->progressive_mode || cinfo->block_size < DCTSIZE) &&
      !cinfo->arith_code)			/*  TEMPORARY HACK ??? */
    /* assume default tables no good for progressive or downscale mode */
    cinfo->optimize_coding = TRUE;

  /* Initialize my private state */
  if (transcode_only) {
    /* no main pass in transcoding */
    if (cinfo->optimize_coding)
      master->pass_type = huff_opt_pass;
    else
      master->pass_type = output_pass;
  } else {
    /* for normal compression, first pass is always this type: */
    master->pass_type = main_pass;
  }
  master->scan_number = 0;
  master->pass_number = 0;
  if (cinfo->optimize_coding)
    master->total_passes = cinfo->num_scans * 2;
  else
    master->total_passes = cinfo->num_scans;
}